

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::addData(Group *this,uint lgSize)

{
  size_t sVar1;
  NullableValue<unsigned_int> location;
  DataLocation *pDVar2;
  NullableValue<unsigned_int> *pNVar3;
  uint *puVar4;
  DataLocationUsage *this_00;
  Group *group;
  uint *puVar5;
  ulong uVar6;
  uint result;
  NullableValue<unsigned_int> local_70;
  NullableValue<unsigned_int> result_1;
  uint i_1;
  uint *best;
  NullableValue<unsigned_int> local_50;
  NullableValue<unsigned_int> hole;
  DataLocationUsage *usage;
  uint local_2c;
  uint i;
  Maybe<unsigned_int> bestLocation;
  uint bestSize;
  uint lgSize_local;
  Group *this_local;
  
  bestLocation.ptr.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2)lgSize;
  addMember(this);
  bestLocation.ptr._0_4_ = kj::MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)&stack0xffffffffffffffd8,(void *)0x0);
  for (local_2c = 0; uVar6 = (ulong)local_2c,
      sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::size
                        (&this->parent->dataLocations), uVar6 < sVar1; local_2c = local_2c + 1) {
    sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
            size(&this->parentDataLocationUsage);
    if (sVar1 == local_2c) {
      kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::add<>
                (&this->parentDataLocationUsage);
    }
    location = (NullableValue<unsigned_int>)
               kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
               operator[](&this->parentDataLocationUsage,(ulong)local_2c);
    hole = location;
    pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
             operator[](&this->parent->dataLocations,(ulong)local_2c);
    DataLocationUsage::smallestHoleAtLeast
              ((DataLocationUsage *)&best,(DataLocation *)location,(uint)pDVar2);
    pNVar3 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&best);
    kj::_::NullableValue<unsigned_int>::NullableValue(&local_50,pNVar3);
    kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&best);
    puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_50);
    if ((puVar4 != (uint *)0x0) &&
       (puVar4 = kj::_::NullableValue<unsigned_int>::operator*(&local_50),
       *puVar4 < (uint)bestLocation.ptr._0_4_)) {
      puVar4 = kj::_::NullableValue<unsigned_int>::operator*(&local_50);
      bestLocation.ptr._0_4_ = *puVar4;
      kj::Maybe<unsigned_int>::operator=((Maybe<unsigned_int> *)&stack0xffffffffffffffd8,&local_2c);
    }
    kj::_::NullableValue<unsigned_int>::~NullableValue(&local_50);
  }
  puVar4 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&stack0xffffffffffffffd8);
  if (puVar4 == (uint *)0x0) {
    result_1.isSet = false;
    result_1._1_3_ = 0;
    for (; uVar6 = (ulong)(uint)result_1._0_4_,
        sVar1 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::size
                          (&this->parent->dataLocations), uVar6 < sVar1;
        result_1._0_4_ = result_1._0_4_ + 1) {
      group = (Group *)kj::
                       Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                       ::operator[](&this->parentDataLocationUsage,(ulong)(uint)result_1._0_4_);
      pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
               operator[](&this->parent->dataLocations,(ulong)(uint)result_1._0_4_);
      DataLocationUsage::tryAllocateByExpanding
                ((DataLocationUsage *)&stack0xffffffffffffff88,group,(DataLocation *)this,
                 (uint)pDVar2);
      pNVar3 = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)&stack0xffffffffffffff88);
      kj::_::NullableValue<unsigned_int>::NullableValue(&local_70,pNVar3);
      kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&stack0xffffffffffffff88);
      puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)&local_70);
      if (puVar4 != (uint *)0x0) {
        puVar5 = kj::_::NullableValue<unsigned_int>::operator*(&local_70);
        this_local._4_4_ = *puVar5;
      }
      result_1.field_1.value._1_3_ = 0;
      result_1.field_1.value._0_1_ = puVar4 != (uint *)0x0;
      kj::_::NullableValue<unsigned_int>::~NullableValue(&local_70);
      if (result_1.field_1.value != 0) goto LAB_0041597a;
    }
    this_local._4_4_ = Union::addNewDataLocation(this->parent,bestLocation.ptr.field_1.value);
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
    add<unsigned_int&>(&this->parentDataLocationUsage,&bestLocation.ptr.field_1.value);
    result_1.field_1.value = 1;
  }
  else {
    this_00 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
              operator[](&this->parentDataLocationUsage,(ulong)*puVar4);
    pDVar2 = kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::
             operator[](&this->parent->dataLocations,(ulong)*puVar4);
    this_local._4_4_ =
         DataLocationUsage::allocateFromHole(this_00,this,pDVar2,bestLocation.ptr.field_1.value);
    result_1.field_1.value = 1;
  }
LAB_0041597a:
  kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&stack0xffffffffffffffd8);
  return this_local._4_4_;
}

Assistant:

uint addData(uint lgSize) override {
      addMember();

      uint bestSize = kj::maxValue;
      kj::Maybe<uint> bestLocation = nullptr;

      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        // If we haven't seen this DataLocation yet, add a corresponding DataLocationUsage.
        if (parentDataLocationUsage.size() == i) {
          parentDataLocationUsage.add();
        }

        auto& usage = parentDataLocationUsage[i];
        KJ_IF_MAYBE(hole, usage.smallestHoleAtLeast(parent.dataLocations[i], lgSize)) {
          if (*hole < bestSize) {
            bestSize = *hole;
            bestLocation = i;
          }
        }
      }

      KJ_IF_MAYBE(best, bestLocation) {
        return parentDataLocationUsage[*best].allocateFromHole(
            *this, parent.dataLocations[*best], lgSize);
      }

      // There are no holes at all in the union big enough to fit this field.  Go back through all
      // of the locations and attempt to expand them to fit.
      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        KJ_IF_MAYBE(result, parentDataLocationUsage[i].tryAllocateByExpanding(
            *this, parent.dataLocations[i], lgSize)) {
          return *result;
        }
      }

      // Couldn't find any space in the existing locations, so add a new one.
      uint result = parent.addNewDataLocation(lgSize);
      parentDataLocationUsage.add(lgSize);
      return result;
    }